

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_utility.cpp
# Opt level: O3

void FCanvasTextureInfo::UpdateAll(void)

{
  AActor *pAVar1;
  FCanvasTextureInfo **ppFVar2;
  FCanvasTextureInfo *pFVar3;
  
  pFVar3 = List;
  if (List != (FCanvasTextureInfo *)0x0) {
    do {
      pAVar1 = (pFVar3->Viewpoint).field_0.p;
      if (pAVar1 != (AActor *)0x0) {
        if (((pAVar1->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
          if (pFVar3->Texture->bNeedsUpdate == true) {
            (*Renderer->_vptr_FRenderer[0x13])();
          }
        }
        else {
          (pFVar3->Viewpoint).field_0.p = (AActor *)0x0;
        }
      }
      ppFVar2 = &pFVar3->Next;
      pFVar3 = *ppFVar2;
    } while (*ppFVar2 != (FCanvasTextureInfo *)0x0);
  }
  return;
}

Assistant:

void FCanvasTextureInfo::UpdateAll ()
{
	FCanvasTextureInfo *probe;

	for (probe = List; probe != NULL; probe = probe->Next)
	{
		if (probe->Viewpoint != NULL && probe->Texture->bNeedsUpdate)
		{
			Renderer->RenderTextureView(probe->Texture, probe->Viewpoint, probe->FOV);
		}
	}
}